

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_mask_sse4.h
# Opt level: O0

void aom_lowbd_blend_a64_d16_mask_subw1_subh0_w4_sse4_1
               (uint8_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int h,
               __m128i *round_offset,int shift)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint in_ECX;
  __m128i *in_RDX;
  uint in_ESI;
  CONV_BUF_TYPE *in_RDI;
  undefined1 auVar4 [16];
  undefined1 auVar5 [64];
  void *in_stack_00000008;
  __m128i m;
  __m128i m_ac;
  __m128i m_i0;
  int i;
  __m128i zeros;
  __m128i one_b;
  __m128i v_maxval;
  int local_11c;
  ulong uStack_110;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff40;
  undefined6 in_stack_ffffffffffffff50;
  undefined2 uVar6;
  
  uVar6 = 0x40;
  auVar1 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar1 = vpinsrw_avx(auVar1,0x40,2);
  auVar1 = vpinsrw_avx(auVar1,0x40,3);
  auVar1 = vpinsrw_avx(auVar1,0x40,4);
  auVar1 = vpinsrw_avx(auVar1,0x40,5);
  auVar1 = vpinsrw_avx(auVar1,0x40,6);
  auVar2 = vpinsrw_avx(auVar1,0x40,7);
  auVar1 = vpinsrb_avx(ZEXT116(1),1,1);
  auVar1 = vpinsrb_avx(auVar1,1,2);
  auVar1 = vpinsrb_avx(auVar1,1,3);
  auVar1 = vpinsrb_avx(auVar1,1,4);
  auVar1 = vpinsrb_avx(auVar1,1,5);
  auVar1 = vpinsrb_avx(auVar1,1,6);
  auVar1 = vpinsrb_avx(auVar1,1,7);
  auVar1 = vpinsrb_avx(auVar1,1,8);
  auVar1 = vpinsrb_avx(auVar1,1,9);
  auVar1 = vpinsrb_avx(auVar1,1,10);
  auVar1 = vpinsrb_avx(auVar1,1,0xb);
  auVar1 = vpinsrb_avx(auVar1,1,0xc);
  auVar1 = vpinsrb_avx(auVar1,1,0xd);
  auVar1 = vpinsrb_avx(auVar1,1,0xe);
  auVar1 = vpinsrb_avx(auVar1,1,0xf);
  auVar5 = ZEXT1664(ZEXT816(0) << 0x20);
  for (local_11c = 0; auVar4 = auVar5._0_16_, local_11c < (int)m[1]; local_11c = local_11c + 1) {
    xx_loadl_64(in_stack_00000008);
    auVar4 = vpmaddubsw_avx(auVar4,auVar1);
    uStack_110 = SUB168(ZEXT816(0),4);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uStack_110;
    auVar4 = vpavgw_avx(auVar4,auVar3 << 0x40);
    auVar5 = ZEXT1664(auVar4);
    blend_a64_d16_mask_w4_sse41
              (auVar2._0_8_,(CONV_BUF_TYPE *)CONCAT26(uVar6,in_stack_ffffffffffffff50),in_RDI,
               (__m128i *)CONCAT44(in_ESI,in_stack_ffffffffffffff40),in_RDX,
               (__m128i *)CONCAT44(in_ECX,in_stack_ffffffffffffff30),(int)v_maxval[0]);
    in_stack_00000008 = (void *)((long)in_stack_00000008 + (ulong)(uint)m[0]);
    in_RDI = (CONV_BUF_TYPE *)((long)in_RDI + (ulong)in_ESI);
    in_RDX = (__m128i *)((long)*in_RDX + (ulong)in_ECX * 2);
  }
  return;
}

Assistant:

static inline void aom_lowbd_blend_a64_d16_mask_subw1_subh0_w4_sse4_1(
    uint8_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int h,
    const __m128i *round_offset, int shift) {
  const __m128i v_maxval = _mm_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i one_b = _mm_set1_epi8(1);
  const __m128i zeros = _mm_setzero_si128();
  for (int i = 0; i < h; ++i) {
    const __m128i m_i0 = xx_loadl_64(mask);
    const __m128i m_ac = _mm_maddubs_epi16(m_i0, one_b);
    const __m128i m = _mm_avg_epu16(m_ac, zeros);

    blend_a64_d16_mask_w4_sse41(dst, src0, src1, &m, round_offset, &v_maxval,
                                shift);
    mask += mask_stride;
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
  }
}